

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexManager.cpp
# Opt level: O1

void __thiscall IndexManager::CreateIndexFile(IndexManager *this,IndexInfo *I)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  string filename;
  BpTree<int> Tree_I;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  BpTree<int> local_190;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>
  local_140;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_local_buf[0] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::operator+(&local_50,&this->Direction,&I->tableName);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_c0 = *plVar4;
    lStack_b8 = plVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar4;
    local_d0 = (long *)*plVar3;
  }
  local_c8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,(ulong)(I->indexName)._M_dataplus._M_p);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    local_190.Index_FileName._M_string_length = *psVar5;
    local_190.Index_FileName.field_2._M_allocated_capacity = plVar3[3];
    local_190._0_8_ = (size_type *)((long)&local_190 + 0x10U);
  }
  else {
    local_190.Index_FileName._M_string_length = *psVar5;
    local_190._0_8_ = (size_type *)*plVar3;
  }
  local_190.Index_FileName._M_dataplus._M_p = (pointer)plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(&local_190.Data_Type);
  paVar1 = &local_140.first.field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_140.first.field_2._M_allocated_capacity = *psVar5;
    local_140.first.field_2._8_8_ = plVar3[3];
    local_140.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_140.first.field_2._M_allocated_capacity = *psVar5;
    local_140.first._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_140.first._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_140.first._M_dataplus._M_p,
                    local_140.first.field_2._M_allocated_capacity + 1);
  }
  if ((size_type *)local_190._0_8_ != (size_type *)((long)&local_190 + 0x10U)) {
    operator_delete((void *)local_190._0_8_,local_190.Index_FileName._M_string_length + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  iVar2 = I->type;
  if (iVar2 == 90000) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_1b0._M_dataplus._M_p,
               local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
    BpTree<float>::BpTree((BpTree<float> *)&local_190,&local_90,'1');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_BpTree<float>_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>
                *)&local_140,&local_1b0,(BpTree<float> *)&local_190);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BpTree<float>>,std::_Select1st<std::pair<std::__cxx11::string_const,BpTree<float>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<float>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,BpTree<float>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BpTree<float>>,std::_Select1st<std::pair<std::__cxx11::string_const,BpTree<float>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<float>>>>
                *)&this->BpTrees_F,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>
                *)&local_140);
  }
  else if (iVar2 == 50000) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_1b0._M_dataplus._M_p,
               local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
    BpTree<int>::BpTree(&local_190,&local_70,'0');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_BpTree<int>_&,_true>
              (&local_140,&local_1b0,&local_190);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BpTree<int>>,std::_Select1st<std::pair<std::__cxx11::string_const,BpTree<int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<int>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,BpTree<int>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BpTree<int>>,std::_Select1st<std::pair<std::__cxx11::string_const,BpTree<int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<int>>>>
                *)&this->BpTrees_I,&local_140);
  }
  else {
    if (iVar2 < 0x1d4c1) goto LAB_001248ab;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_1b0._M_dataplus._M_p,
               local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
    BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BpTree
              ((BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_190,&local_b0,'2');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_140,&local_1b0,
               (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_190);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BpTree<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,BpTree<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<std::__cxx11::string>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,BpTree<std::__cxx11::string>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BpTree<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,BpTree<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<std::__cxx11::string>>>>
                *)&this->BpTrees_S,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_140);
  }
  if (local_140.second.FileOff_bin.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.second.FileOff_bin.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.second.FileOff_bin.super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.second.FileOff_bin.super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.second.Index_FileName._M_dataplus._M_p !=
      &local_140.second.Index_FileName.field_2) {
    operator_delete(local_140.second.Index_FileName._M_dataplus._M_p,
                    local_140.second.Index_FileName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_140.first._M_dataplus._M_p,
                    local_140.first.field_2._M_allocated_capacity + 1);
  }
  if (local_190.FileOff_bin.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.FileOff_bin.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_190.FileOff_bin.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.FileOff_bin.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.Index_FileName._M_dataplus._M_p != &local_190.Index_FileName.field_2) {
    operator_delete(local_190.Index_FileName._M_dataplus._M_p,
                    local_190.Index_FileName.field_2._M_allocated_capacity + 1);
  }
LAB_001248ab:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,
                    CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                             local_1b0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void IndexManager::CreateIndexFile(IndexInfo I) {
	string filename;
	cout<<"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx"<<endl;
	filename = Direction + I.tableName + "_" + I.indexName + "_idx.dat";
	cout<<filename;
	if (I.type == 50000) {
		BpTree<int> Tree_I = BpTree<int>(filename, INT);
		this->BpTrees_I.insert(pair<string, BpTree<int> > (filename, Tree_I));
	}
	else if (I.type == 90000) {
		BpTree<float> Tree_F = BpTree<float>(filename, FLOAT);
		this->BpTrees_F.insert(pair<string, BpTree<float> >(filename, Tree_F));
	}
	else if (I.type > 120000) {
		BpTree<string> Tree_S = BpTree<string>(filename, STRING);
		this->BpTrees_S.insert(pair<string, BpTree<string> >(filename, Tree_S));
	}
}